

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O3

char * __thiscall Crypt::crypt(Crypt *this,char *__key,char *__salt)

{
  deque<int,_std::allocator<int>_> *pdVar1;
  deque<int,_std::allocator<int>_> *__x;
  deque<int,_std::allocator<int>_> *pdVar2;
  deque<int,_std::allocator<int>_> *pdVar3;
  deque<int,_std::allocator<int>_> *this_00;
  DES c2;
  DESinv d;
  DES c1;
  SequenceD<64> local_500;
  SequenceD<64> local_450;
  SequenceD<64> local_3a0;
  SequenceD<64> local_2f0;
  SequenceD<64> local_240;
  SequenceD<64> local_190;
  DES local_e0;
  
  DES::DES(&local_e0,&this->m_k1);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  pdVar1 = (deque<int,_std::allocator<int>_> *)(__key + 8);
  std::deque<int,_std::allocator<int>_>::deque(&local_2f0.super_Sequence.m_bits,pdVar1);
  pdVar2 = &local_2f0.m_other.m_bits;
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_2f0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  __x = (deque<int,_std::allocator<int>_> *)(__key + 0x60);
  std::deque<int,_std::allocator<int>_>::deque(pdVar2,__x);
  DES::operator()(&local_450,&local_e0,&local_2f0);
  std::deque<int,_std::allocator<int>_>::operator=(pdVar1,&local_450.super_Sequence.m_bits);
  pdVar3 = &local_450.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=(__x,pdVar3);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_450.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar3->super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_2f0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2f0.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  DESinv::DESinv((DESinv *)&local_450,&this->m_k2);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::deque<int,_std::allocator<int>_>::deque(&local_3a0.super_Sequence.m_bits,pdVar1);
  pdVar3 = &local_3a0.m_other.m_bits;
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_3a0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar3,__x);
  DESinv::operator()(&local_500,(DESinv *)&local_450,&local_3a0);
  std::deque<int,_std::allocator<int>_>::operator=(pdVar1,&local_500.super_Sequence.m_bits);
  pdVar2 = &local_500.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=(__x,pdVar2);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_500.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_3a0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar3->super__Deque_base<int,_std::allocator<int>_>);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_3a0.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  DES::DES((DES *)&local_500,&this->m_k1);
  pdVar2 = &local_240.super_Sequence.m_bits;
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar2,pdVar1);
  pdVar3 = &local_240.m_other.m_bits;
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_240.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar3,__x);
  DES::operator()(&local_190,(DES *)&local_500,&local_240);
  this_00 = &local_190.super_Sequence.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=(pdVar1,this_00);
  pdVar1 = &local_190.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=(__x,pdVar1);
  local_190.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_190.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar1->super__Deque_base<int,_std::allocator<int>_>);
  local_190.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&this_00->super__Deque_base<int,_std::allocator<int>_>);
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_240.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar3->super__Deque_base<int,_std::allocator<int>_>);
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_500.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_450.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_e0.m_key.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_e0.m_key.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_e0.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_e0.m_key.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_e0.m_key.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  return __key;
}

Assistant:

SequenceD<64> &Crypt::crypt(SequenceD<64> &seq) {
    DES c1(m_k1);
    seq = c1(seq);
    DESinv d(m_k2);
    seq = d(seq);
    DES c2(m_k1);
    seq = c2(seq);
    return seq;
}